

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

int linenoiseHistoryLoad(char *filename)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char buf [4096];
  char acStack_1018 [4104];
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    pcVar2 = fgets(acStack_1018,0x1000,__stream);
    while (pcVar2 != (char *)0x0) {
      pcVar2 = strchr(acStack_1018,0xd);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strchr(acStack_1018,10);
      }
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      linenoiseHistoryAdd(acStack_1018);
      pcVar2 = fgets(acStack_1018,0x1000,__stream);
    }
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int linenoiseHistoryLoad(const char *filename) {
    FILE *fp = fopen(filename,"r");
    char buf[LINENOISE_MAX_LINE];

    if (fp == NULL) return -1;

    while (fgets(buf,LINENOISE_MAX_LINE,fp) != NULL) {
        char *p;

        p = strchr(buf,'\r');
        if (!p) p = strchr(buf,'\n');
        if (p) *p = '\0';
        linenoiseHistoryAdd(buf);
    }
    fclose(fp);
    return 0;
}